

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

void __thiscall Js::SourceDynamicProfileManager::Reuse(SourceDynamicProfileManager *this)

{
  code *pcVar1;
  bool bVar2;
  SimpleDataCacheWrapper **ppSVar3;
  undefined4 *puVar4;
  BVFixed **ppBVar5;
  SourceDynamicProfileManager *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDataCacheWrapper__
                      ((WriteBarrierPtr *)&this->dataCacheWrapper);
  if (*ppSVar3 != (SimpleDataCacheWrapper *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x57,"(dataCacheWrapper == nullptr)",
                                "Persisted profiles cannot be re-used");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                      ((WriteBarrierPtr *)&this->startupFunctions);
  Memory::WriteBarrierPtr<const_BVFixed>::operator=(&this->cachedStartupFunctions,*ppBVar5);
  return;
}

Assistant:

void SourceDynamicProfileManager::Reuse()
    {
        AssertMsg(dataCacheWrapper == nullptr, "Persisted profiles cannot be re-used");
        cachedStartupFunctions = startupFunctions;
    }